

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::read_content_with_length
               (Stream *strm,string *out,size_t len,Progress *progress)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ulong __args;
  
  std::__cxx11::string::assign((ulong)out,(char)len);
  __args = 0;
  do {
    do {
      uVar3 = __args;
      if (len <= uVar3) goto LAB_0015e316;
      uVar2 = (*strm->_vptr_Stream[2])(strm,(out->_M_dataplus)._M_p + uVar3);
      if ((int)uVar2 < 1) goto LAB_0015e316;
      __args = uVar2 + uVar3;
    } while ((progress->super__Function_base)._M_manager == (_Manager_type)0x0);
    bVar1 = std::function<bool_(unsigned_long,_unsigned_long)>::operator()(progress,__args,len);
  } while (bVar1);
LAB_0015e316:
  return len <= uVar3;
}

Assistant:

inline bool read_content_with_length(Stream& strm, std::string& out, size_t len, Progress progress)
{
    out.assign(len, 0);
    size_t r = 0;
    while (r < len){
        auto n = strm.read(&out[r], len - r);
        if (n <= 0) {
            return false;
        }

        r += n;

        if (progress) {
            if (!progress(r, len)) {
                return false;
            }
        }
    }

    return true;
}